

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

bool __thiscall slang::parsing::Lexer::isNextTokenOnSameLine(Lexer *this)

{
  byte *pbVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  ulong uVar5;
  
  pbVar1 = (byte *)this->sourceBuffer;
  pbVar4 = pbVar1;
LAB_00398f04:
  uVar5 = (ulong)*pbVar4;
  bVar2 = true;
  if (uVar5 < 0x30) {
    if ((0x100001a00U >> (uVar5 & 0x3f) & 1) != 0) {
      pbVar4 = pbVar4 + 1;
      goto LAB_00398f19;
    }
    if (uVar5 == 0x2f) {
      if (pbVar4[1] == 0x2a) {
        pbVar4 = pbVar4 + 2;
LAB_00398f34:
        this->sourceBuffer = (char *)pbVar4;
        pbVar3 = pbVar4;
        if (*pbVar4 == 0x2a) {
          this->sourceBuffer = (char *)(pbVar4 + 1);
          pbVar3 = pbVar4 + 1;
          if (pbVar4[1] == 0x2f) goto LAB_00398f62;
        }
        pbVar4 = pbVar3 + 1;
        if ((*pbVar3 == 0) && (this->sourceEnd + -1 <= pbVar3)) goto LAB_00398f73;
        goto LAB_00398f34;
      }
      if (pbVar4[1] != 0x2f) goto LAB_00398f75;
    }
    else if ((0x2401UL >> (uVar5 & 0x3f) & 1) == 0) goto LAB_00398f75;
LAB_00398f73:
    bVar2 = false;
  }
LAB_00398f75:
  this->sourceBuffer = (char *)pbVar1;
  return bVar2;
LAB_00398f62:
  pbVar4 = pbVar4 + 2;
LAB_00398f19:
  this->sourceBuffer = (char *)pbVar4;
  goto LAB_00398f04;
}

Assistant:

bool Lexer::isNextTokenOnSameLine() {
    auto guard = ScopeGuard([this, currBuff = sourceBuffer] { sourceBuffer = currBuff; });

    while (true) {
        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                break;
            case '/':
                switch (peek(1)) {
                    case '/':
                        return false;
                    case '*':
                        advance(2);
                        while (true) {
                            if (consume('*') && consume('/'))
                                break;
                            if (peek() == '\0' && reallyAtEnd())
                                return false;
                            advance();
                        }
                        break;
                    default:
                        return true;
                }
                break;
            case '\0':
            case '\r':
            case '\n':
                return false;
            default:
                return true;
        }
    }
}